

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.h
# Opt level: O0

void pybind11::initialize_interpreter(bool init_signal_handlers)

{
  int iVar1;
  module local_40;
  str_attr_accessor local_38;
  undefined1 local_18 [23];
  bool init_signal_handlers_local;
  
  local_18[0xf] = init_signal_handlers;
  iVar1 = Py_IsInitialized();
  if (iVar1 != 0) {
    pybind11_fail("The interpreter is already running");
  }
  Py_InitializeEx(local_18[0xf] & 1);
  module::import(&local_40,"sys");
  detail::object_api<pybind11::handle>::attr
            (&local_38,(object_api<pybind11::handle> *)&local_40,"path");
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<pybind11::list>
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_18);
  list::append<char_const(&)[2]>((list *)local_18,(char (*) [2])0x13e75c);
  list::~list((list *)local_18);
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_38);
  module::~module(&local_40);
  return;
}

Assistant:

inline void initialize_interpreter(bool init_signal_handlers = true) {
    if (Py_IsInitialized())
        pybind11_fail("The interpreter is already running");

    Py_InitializeEx(init_signal_handlers ? 1 : 0);

    // Make .py files in the working directory available by default
    module::import("sys").attr("path").cast<list>().append(".");
}